

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O2

string * query_str<char_const(&)[19]>(string *__return_storage_ptr__,char (*prompt) [19])

{
  std::operator<<((ostream *)&std::cout,*prompt);
  std::ostream::flush();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string query_str(T && prompt)
{
    std::cout << std::forward<T>(prompt) << std::flush;

    std::string input;
    std::getline(std::cin, input);

    return input;
}